

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

void re2::PatchList::Patch(Inst *inst0,PatchList l,uint32 val)

{
  uint uVar1;
  uint uVar2;
  
  if (l.p != 0) {
    do {
      uVar2 = l.p >> 1;
      uVar1 = inst0[uVar2].out_opcode_;
      if ((l.p & 1) == 0) {
        l.p = uVar1 >> 4;
        inst0[uVar2].out_opcode_ = uVar1 & 0xf | val << 4;
      }
      else {
        if ((uVar1 & 6) != 0) {
          __assert_fail("opcode() == kInstAlt || opcode() == kInstAltMatch",
                        "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.h"
                        ,0x6d,"int re2::Prog::Inst::out1()");
        }
        l.p = inst0[uVar2].field_1.out1_;
        inst0[uVar2].field_1.out1_ = val;
      }
    } while (l.p != 0);
  }
  return;
}

Assistant:

void PatchList::Patch(Prog::Inst *inst0, PatchList l, uint32 val) {
  while (l.p != 0) {
    Prog::Inst* ip = &inst0[l.p>>1];
    if (l.p&1) {
      l.p = ip->out1();
      ip->out1_ = val;
    } else {
      l.p = ip->out();
      ip->set_out(val);
    }
  }
}